

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::dumpProgramBuildLog
          (CLIntercept *this,cl_program program,cl_device_id device,char *buildLog,
          size_t buildLogSize)

{
  double __x;
  SConfig *pSVar1;
  cl_icd_dispatch *__lhs;
  cl_device_id in_RDX;
  CLIntercept *in_RDI;
  size_t in_stack_00000010;
  void *in_stack_00000018;
  bool in_stack_00000027;
  string *in_stack_00000028;
  CLIntercept *in_stack_00000030;
  cl_device_type deviceType;
  char numberString [256];
  string fileName;
  SProgramInfo *programInfo;
  char *in_stack_fffffffffffffdd0;
  string *psVar2;
  Services_Common *this_00;
  string *in_stack_fffffffffffffe00;
  key_type *in_stack_fffffffffffffe08;
  map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
  *in_stack_fffffffffffffe10;
  allocator *this_01;
  _Swallow_assign *this_02;
  string local_1d0 [32];
  string local_1b0 [32];
  ulong local_190;
  char local_188 [263];
  allocator local_81;
  string local_80 [48];
  string local_50 [32];
  mapped_type *local_30;
  char *local_20;
  cl_device_id local_18;
  
  local_18 = in_RDX;
  pSVar1 = config(in_RDI);
  this_02 = (_Swallow_assign *)&std::ignore;
  std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&pSVar1->DumpProgramBuildLogs);
  std::_Swallow_assign::operator=(this_02,&local_20);
  local_30 = std::
             map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
             ::operator[](in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::__cxx11::string::string(local_50);
  OS(in_RDI);
  this_01 = &local_81;
  psVar2 = (string *)sc_DumpDirectoryName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,(char *)psVar2,this_01);
  ::OS::Services_Common::GetDumpDirectoryName
            ((Services_Common *)this_01,psVar2,in_stack_fffffffffffffe00);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  psVar2 = (string *)0x0;
  this_00 = (Services_Common *)0x0;
  local_188[0xf0] = '\0';
  local_188[0xf1] = '\0';
  local_188[0xf2] = '\0';
  local_188[0xf3] = '\0';
  local_188[0xf4] = '\0';
  local_188[0xf5] = '\0';
  local_188[0xf6] = '\0';
  local_188[0xf7] = '\0';
  local_188[0xf8] = '\0';
  local_188[0xf9] = '\0';
  local_188[0xfa] = '\0';
  local_188[0xfb] = '\0';
  local_188[0xfc] = '\0';
  local_188[0xfd] = '\0';
  local_188[0xfe] = '\0';
  local_188[0xff] = '\0';
  local_188[0xe0] = '\0';
  local_188[0xe1] = '\0';
  local_188[0xe2] = '\0';
  local_188[0xe3] = '\0';
  local_188[0xe4] = '\0';
  local_188[0xe5] = '\0';
  local_188[0xe6] = '\0';
  local_188[0xe7] = '\0';
  local_188[0xe8] = '\0';
  local_188[0xe9] = '\0';
  local_188[0xea] = '\0';
  local_188[0xeb] = '\0';
  local_188[0xec] = '\0';
  local_188[0xed] = '\0';
  local_188[0xee] = '\0';
  local_188[0xef] = '\0';
  local_188[0xd0] = '\0';
  local_188[0xd1] = '\0';
  local_188[0xd2] = '\0';
  local_188[0xd3] = '\0';
  local_188[0xd4] = '\0';
  local_188[0xd5] = '\0';
  local_188[0xd6] = '\0';
  local_188[0xd7] = '\0';
  local_188[0xd8] = '\0';
  local_188[0xd9] = '\0';
  local_188[0xda] = '\0';
  local_188[0xdb] = '\0';
  local_188[0xdc] = '\0';
  local_188[0xdd] = '\0';
  local_188[0xde] = '\0';
  local_188[0xdf] = '\0';
  local_188[0xc0] = '\0';
  local_188[0xc1] = '\0';
  local_188[0xc2] = '\0';
  local_188[0xc3] = '\0';
  local_188[0xc4] = '\0';
  local_188[0xc5] = '\0';
  local_188[0xc6] = '\0';
  local_188[199] = '\0';
  local_188[200] = '\0';
  local_188[0xc9] = '\0';
  local_188[0xca] = '\0';
  local_188[0xcb] = '\0';
  local_188[0xcc] = '\0';
  local_188[0xcd] = '\0';
  local_188[0xce] = '\0';
  local_188[0xcf] = '\0';
  local_188[0xb0] = '\0';
  local_188[0xb1] = '\0';
  local_188[0xb2] = '\0';
  local_188[0xb3] = '\0';
  local_188[0xb4] = '\0';
  local_188[0xb5] = '\0';
  local_188[0xb6] = '\0';
  local_188[0xb7] = '\0';
  local_188[0xb8] = '\0';
  local_188[0xb9] = '\0';
  local_188[0xba] = '\0';
  local_188[0xbb] = '\0';
  local_188[0xbc] = '\0';
  local_188[0xbd] = '\0';
  local_188[0xbe] = '\0';
  local_188[0xbf] = '\0';
  local_188[0xa0] = '\0';
  local_188[0xa1] = '\0';
  local_188[0xa2] = '\0';
  local_188[0xa3] = '\0';
  local_188[0xa4] = '\0';
  local_188[0xa5] = '\0';
  local_188[0xa6] = '\0';
  local_188[0xa7] = '\0';
  local_188[0xa8] = '\0';
  local_188[0xa9] = '\0';
  local_188[0xaa] = '\0';
  local_188[0xab] = '\0';
  local_188[0xac] = '\0';
  local_188[0xad] = '\0';
  local_188[0xae] = '\0';
  local_188[0xaf] = '\0';
  local_188[0x90] = '\0';
  local_188[0x91] = '\0';
  local_188[0x92] = '\0';
  local_188[0x93] = '\0';
  local_188[0x94] = '\0';
  local_188[0x95] = '\0';
  local_188[0x96] = '\0';
  local_188[0x97] = '\0';
  local_188[0x98] = '\0';
  local_188[0x99] = '\0';
  local_188[0x9a] = '\0';
  local_188[0x9b] = '\0';
  local_188[0x9c] = '\0';
  local_188[0x9d] = '\0';
  local_188[0x9e] = '\0';
  local_188[0x9f] = '\0';
  local_188[0x80] = '\0';
  local_188[0x81] = '\0';
  local_188[0x82] = '\0';
  local_188[0x83] = '\0';
  local_188[0x84] = '\0';
  local_188[0x85] = '\0';
  local_188[0x86] = '\0';
  local_188[0x87] = '\0';
  local_188[0x88] = '\0';
  local_188[0x89] = '\0';
  local_188[0x8a] = '\0';
  local_188[0x8b] = '\0';
  local_188[0x8c] = '\0';
  local_188[0x8d] = '\0';
  local_188[0x8e] = '\0';
  local_188[0x8f] = '\0';
  local_188[0x70] = '\0';
  local_188[0x71] = '\0';
  local_188[0x72] = '\0';
  local_188[0x73] = '\0';
  local_188[0x74] = '\0';
  local_188[0x75] = '\0';
  local_188[0x76] = '\0';
  local_188[0x77] = '\0';
  local_188[0x78] = '\0';
  local_188[0x79] = '\0';
  local_188[0x7a] = '\0';
  local_188[0x7b] = '\0';
  local_188[0x7c] = '\0';
  local_188[0x7d] = '\0';
  local_188[0x7e] = '\0';
  local_188[0x7f] = '\0';
  local_188[0x60] = '\0';
  local_188[0x61] = '\0';
  local_188[0x62] = '\0';
  local_188[99] = '\0';
  local_188[100] = '\0';
  local_188[0x65] = '\0';
  local_188[0x66] = '\0';
  local_188[0x67] = '\0';
  local_188[0x68] = '\0';
  local_188[0x69] = '\0';
  local_188[0x6a] = '\0';
  local_188[0x6b] = '\0';
  local_188[0x6c] = '\0';
  local_188[0x6d] = '\0';
  local_188[0x6e] = '\0';
  local_188[0x6f] = '\0';
  local_188[0x50] = '\0';
  local_188[0x51] = '\0';
  local_188[0x52] = '\0';
  local_188[0x53] = '\0';
  local_188[0x54] = '\0';
  local_188[0x55] = '\0';
  local_188[0x56] = '\0';
  local_188[0x57] = '\0';
  local_188[0x58] = '\0';
  local_188[0x59] = '\0';
  local_188[0x5a] = '\0';
  local_188[0x5b] = '\0';
  local_188[0x5c] = '\0';
  local_188[0x5d] = '\0';
  local_188[0x5e] = '\0';
  local_188[0x5f] = '\0';
  local_188[0x40] = '\0';
  local_188[0x41] = '\0';
  local_188[0x42] = '\0';
  local_188[0x43] = '\0';
  local_188[0x44] = '\0';
  local_188[0x45] = '\0';
  local_188[0x46] = '\0';
  local_188[0x47] = '\0';
  local_188[0x48] = '\0';
  local_188[0x49] = '\0';
  local_188[0x4a] = '\0';
  local_188[0x4b] = '\0';
  local_188[0x4c] = '\0';
  local_188[0x4d] = '\0';
  local_188[0x4e] = '\0';
  local_188[0x4f] = '\0';
  local_188[0x30] = '\0';
  local_188[0x31] = '\0';
  local_188[0x32] = '\0';
  local_188[0x33] = '\0';
  local_188[0x34] = '\0';
  local_188[0x35] = '\0';
  local_188[0x36] = '\0';
  local_188[0x37] = '\0';
  local_188[0x38] = '\0';
  local_188[0x39] = '\0';
  local_188[0x3a] = '\0';
  local_188[0x3b] = '\0';
  local_188[0x3c] = '\0';
  local_188[0x3d] = '\0';
  local_188[0x3e] = '\0';
  local_188[0x3f] = '\0';
  local_188[0x20] = '\0';
  local_188[0x21] = '\0';
  local_188[0x22] = '\0';
  local_188[0x23] = '\0';
  local_188[0x24] = '\0';
  local_188[0x25] = '\0';
  local_188[0x26] = '\0';
  local_188[0x27] = '\0';
  local_188[0x28] = '\0';
  local_188[0x29] = '\0';
  local_188[0x2a] = '\0';
  local_188[0x2b] = '\0';
  local_188[0x2c] = '\0';
  local_188[0x2d] = '\0';
  local_188[0x2e] = '\0';
  local_188[0x2f] = '\0';
  local_188[0x10] = '\0';
  local_188[0x11] = '\0';
  local_188[0x12] = '\0';
  local_188[0x13] = '\0';
  local_188[0x14] = '\0';
  local_188[0x15] = '\0';
  local_188[0x16] = '\0';
  local_188[0x17] = '\0';
  local_188[0x18] = '\0';
  local_188[0x19] = '\0';
  local_188[0x1a] = '\0';
  local_188[0x1b] = '\0';
  local_188[0x1c] = '\0';
  local_188[0x1d] = '\0';
  local_188[0x1e] = '\0';
  local_188[0x1f] = '\0';
  local_188[0] = '\0';
  local_188[1] = '\0';
  local_188[2] = '\0';
  local_188[3] = '\0';
  local_188[4] = '\0';
  local_188[5] = '\0';
  local_188[6] = '\0';
  local_188[7] = '\0';
  local_188[8] = '\0';
  local_188[9] = '\0';
  local_188[10] = '\0';
  local_188[0xb] = '\0';
  local_188[0xc] = '\0';
  local_188[0xd] = '\0';
  local_188[0xe] = '\0';
  local_188[0xf] = '\0';
  pSVar1 = config(in_RDI);
  if ((pSVar1->OmitProgramNumber & 1U) == 0) {
    snprintf(local_188,0x100,"%04u_%08X_%04u_%08X",(ulong)local_30->ProgramNumber,
             local_30->ProgramHash & 0xffffffff,(ulong)local_30->CompileCount,
             (int)local_30->OptionsHash);
  }
  else {
    snprintf(local_188,0x100,"%08X_%04u_%08X",local_30->ProgramHash & 0xffffffff,
             (ulong)local_30->CompileCount,local_30->OptionsHash & 0xffffffff);
  }
  std::__cxx11::string::operator+=(local_50,"/CLI_");
  std::__cxx11::string::operator+=(local_50,local_188);
  OS(in_RDI);
  ::OS::Services_Common::MakeDumpDirectories(this_00,psVar2);
  local_190 = 1;
  __lhs = dispatch(in_RDI);
  (*__lhs->clGetDeviceInfo)(local_18,0x1000,8,&local_190,(size_t *)0x0);
  if ((local_190 & 2) != 0) {
    std::__cxx11::string::operator+=(local_50,"_CPU");
  }
  if ((local_190 & 4) != 0) {
    std::__cxx11::string::operator+=(local_50,"_GPU");
  }
  if ((local_190 & 8) != 0) {
    std::__cxx11::string::operator+=(local_50,"_ACC");
  }
  if ((local_190 & 0x10) != 0) {
    std::__cxx11::string::operator+=(local_50,"_CUSTOM");
  }
  std::__cxx11::string::operator+=(local_50,"_build_log.txt");
  std::operator+((char *)this_02,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  __x = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __lhs,in_stack_fffffffffffffdd0);
  log(in_RDI,__x);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string(local_1d0);
  dumpMemoryToFile(in_stack_00000030,in_stack_00000028,in_stack_00000027,in_stack_00000018,
                   in_stack_00000010);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void CLIntercept::dumpProgramBuildLog(
    const cl_program program,
    const cl_device_id device,
    const char* buildLog,
    const size_t buildLogSize )
{
    // We're already in a critical section when we get here, so we don't need to
    // grab the critical section again.

    CLI_ASSERT( config().DumpProgramBuildLogs );
    CLI_ASSERT( buildLog );

    const SProgramInfo& programInfo = m_ProgramInfoMap[ program ];

    std::string fileName;

    // Get the dump directory name.
    {
        OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
    }
    // Make the file name.  It will have the form:
    //   CLI_<program number>_<program hash>_<compile count>_<options hash>
    // Leave off the extension for now.
    {
        char    numberString[256] = "";

        if( config().OmitProgramNumber )
        {
            CLI_SPRINTF( numberString, 256, "%08X_%04u_%08X",
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }
        else
        {
            CLI_SPRINTF( numberString, 256, "%04u_%08X_%04u_%08X",
                programInfo.ProgramNumber,
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }

        fileName += "/CLI_";
        fileName += numberString;
    }
    // Now make directories as appropriate.
    {
        OS().MakeDumpDirectories( fileName );
    }

    cl_device_type  deviceType = CL_DEVICE_TYPE_DEFAULT;

    // It's OK if this fails.  If it does, it just
    // means that our output file won't have a device
    // type.
    dispatch().clGetDeviceInfo(
        device,
        CL_DEVICE_TYPE,
        sizeof( deviceType ),
        &deviceType,
        NULL );

    if( deviceType & CL_DEVICE_TYPE_CPU )
    {
        fileName += "_CPU";
    }
    if( deviceType & CL_DEVICE_TYPE_GPU )
    {
        fileName += "_GPU";
    }
    if( deviceType & CL_DEVICE_TYPE_ACCELERATOR )
    {
        fileName += "_ACC";
    }
    if( deviceType & CL_DEVICE_TYPE_CUSTOM )
    {
        fileName += "_CUSTOM";
    }

    fileName += "_build_log.txt";

    log( "Dumping build log to file: " + fileName + "\n" );
    dumpMemoryToFile(
        fileName,
        false,
        buildLog,
        buildLogSize );
}